

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void build_tree(deflate_state *s,tree_desc *desc)

{
  ct_data *tree_00;
  ct_data *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uch local_44;
  int local_40;
  int local_3c;
  int local_38;
  int node;
  int max_code;
  int m;
  int n;
  int elems;
  ct_data *stree;
  ct_data *tree;
  tree_desc *desc_local;
  deflate_state *s_local;
  
  tree_00 = desc->dyn_tree;
  pcVar1 = desc->stat_desc->static_tree;
  local_3c = desc->stat_desc->elems;
  local_38 = -1;
  s->heap_len = 0;
  s->heap_max = 0x23d;
  for (max_code = 0; max_code < local_3c; max_code = max_code + 1) {
    if (tree_00[max_code].fc.freq == 0) {
      tree_00[max_code].dl.dad = 0;
    }
    else {
      local_38 = max_code;
      iVar2 = s->heap_len + 1;
      s->heap_len = iVar2;
      s->heap[iVar2] = max_code;
      s->depth[max_code] = '\0';
    }
  }
  while (s->heap_len < 2) {
    if (local_38 < 2) {
      local_40 = local_38 + 1;
      local_38 = local_40;
    }
    else {
      local_40 = 0;
    }
    iVar2 = s->heap_len + 1;
    s->heap_len = iVar2;
    s->heap[iVar2] = local_40;
    tree_00[local_40].fc.freq = 1;
    s->depth[local_40] = '\0';
    s->opt_len = s->opt_len - 1;
    if (pcVar1 != (ct_data *)0x0) {
      s->static_len = s->static_len - (ulong)pcVar1[local_40].dl.dad;
    }
  }
  desc->max_code = local_38;
  for (max_code = s->heap_len / 2; 0 < max_code; max_code = max_code + -1) {
    pqdownheap(s,tree_00,max_code);
  }
  do {
    iVar2 = s->heap[1];
    iVar4 = s->heap_len;
    s->heap_len = iVar4 + -1;
    s->heap[1] = s->heap[iVar4];
    pqdownheap(s,tree_00,1);
    iVar4 = s->heap[1];
    iVar3 = s->heap_max + -1;
    s->heap_max = iVar3;
    s->heap[iVar3] = iVar2;
    iVar3 = s->heap_max + -1;
    s->heap_max = iVar3;
    s->heap[iVar3] = iVar4;
    tree_00[local_3c].fc.freq = tree_00[iVar2].fc.freq + tree_00[iVar4].fc.freq;
    if (s->depth[iVar2] < s->depth[iVar4]) {
      local_44 = s->depth[iVar4];
    }
    else {
      local_44 = s->depth[iVar2];
    }
    s->depth[local_3c] = local_44 + '\x01';
    tree_00[iVar4].dl.dad = (ush)local_3c;
    tree_00[iVar2].dl.dad = (ush)local_3c;
    s->heap[1] = local_3c;
    pqdownheap(s,tree_00,1);
    local_3c = local_3c + 1;
  } while (1 < s->heap_len);
  iVar2 = s->heap[1];
  iVar4 = s->heap_max + -1;
  s->heap_max = iVar4;
  s->heap[iVar4] = iVar2;
  gen_bitlen(s,desc);
  gen_codes(tree_00,local_38,s->bl_count);
  return;
}

Assistant:

local void build_tree(deflate_state *s, tree_desc *desc)
{
    ct_data *tree         = desc->dyn_tree;
    const ct_data *stree  = desc->stat_desc->static_tree;
    int elems             = desc->stat_desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node;          /* new node being created */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n+1].
     * heap[0] is not used.
     */
    s->heap_len = 0, s->heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            s->heap[++(s->heap_len)] = max_code = n;
            s->depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (s->heap_len < 2) {
        node = s->heap[++(s->heap_len)] = (max_code < 2 ? ++max_code : 0);
        tree[node].Freq = 1;
        s->depth[node] = 0;
        s->opt_len--; if (stree) s->static_len -= stree[node].Len;
        /* node is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2+1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = s->heap_len/2; n >= 1; n--) pqdownheap(s, tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    node = elems;              /* next internal node of the tree */
    do {
        pqremove(s, tree, n);  /* n = node of least frequency */
        m = s->heap[SMALLEST]; /* m = node of next least frequency */

        s->heap[--(s->heap_max)] = n; /* keep the nodes sorted by frequency */
        s->heap[--(s->heap_max)] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = tree[n].Freq + tree[m].Freq;
        s->depth[node] = (uch)((s->depth[n] >= s->depth[m] ?
                                s->depth[n] : s->depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (ush)node;
#ifdef DUMP_BL_TREE
        if (tree == s->bl_tree) {
            fprintf(stderr,"\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        s->heap[SMALLEST] = node++;
        pqdownheap(s, tree, SMALLEST);

    } while (s->heap_len >= 2);

    s->heap[--(s->heap_max)] = s->heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen(s, (tree_desc *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes ((ct_data *)tree, max_code, s->bl_count);
}